

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

QString * __thiscall
QTimeZone::abbreviation(QString *__return_storage_ptr__,QTimeZone *this,QDateTime *atDateTime)

{
  QTimeZonePrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  qint64 qVar4;
  long in_FS_OFFSET;
  QUtcTimeZonePrivate QStack_98;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 3) == 0) {
    if (((this->d).d != (QTimeZonePrivate *)0x0) &&
       (bVar2 = QTimeZonePrivate::isValid((this->d).d), bVar2)) {
      pQVar1 = (this->d).d;
      qVar4 = QDateTime::toMSecsSinceEpoch(atDateTime);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (*pQVar1->_vptr_QTimeZonePrivate[7])(__return_storage_ptr__,pQVar1,qVar4);
        return __return_storage_ptr__;
      }
      goto LAB_00358915;
    }
LAB_00358878:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00358915;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    uVar3 = (int)pQVar1 - 1U & 3;
    if (uVar3 - 1 < 2) {
      QUtcTimeZonePrivate::QUtcTimeZonePrivate(&QStack_98,(qint32)((ulong)pQVar1 >> 2));
      qVar4 = QDateTime::toMSecsSinceEpoch(atDateTime);
      QUtcTimeZonePrivate::abbreviation(__return_storage_ptr__,&QStack_98,qVar4);
      QUtcTimeZonePrivate::~QUtcTimeZonePrivate(&QStack_98);
    }
    else {
      if (uVar3 == 3) goto LAB_00358878;
      systemTimeZone();
      abbreviation(__return_storage_ptr__,(QTimeZone *)&QStack_98,atDateTime);
      ~QTimeZone((QTimeZone *)&QStack_98);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_00358915:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTimeZone::abbreviation(const QDateTime &atDateTime) const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().abbreviation(atDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            return QUtcTimeZonePrivate(d.s.offset).abbreviation(atDateTime.toMSecsSinceEpoch());
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (isValid()) {
        return d->abbreviation(atDateTime.toMSecsSinceEpoch());
    }

    return QString();
}